

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGSchemaTypeCompare
              (void *data,xmlChar *type,xmlChar *value1,xmlNodePtr ctxt1,void *comp1,xmlChar *value2
              ,xmlNodePtr ctxt2)

{
  int iVar1;
  xmlSchemaValPtr local_60;
  xmlSchemaValPtr res2;
  xmlSchemaValPtr res1;
  xmlSchemaTypePtr_conflict typ;
  xmlChar *pxStack_40;
  int ret;
  xmlChar *value2_local;
  void *comp1_local;
  xmlNodePtr ctxt1_local;
  xmlChar *value1_local;
  xmlChar *type_local;
  void *data_local;
  
  res2 = (xmlSchemaValPtr)0x0;
  local_60 = (xmlSchemaValPtr)0x0;
  if (((type == (xmlChar *)0x0) || (value1 == (xmlChar *)0x0)) || (value2 == (xmlChar *)0x0)) {
    data_local._4_4_ = -1;
  }
  else {
    pxStack_40 = value2;
    value2_local = (xmlChar *)comp1;
    comp1_local = ctxt1;
    ctxt1_local = (xmlNodePtr)value1;
    value1_local = type;
    type_local = (xmlChar *)data;
    res1 = (xmlSchemaValPtr)
           xmlSchemaGetPredefinedType(type,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
    if ((xmlSchemaTypePtr)res1 == (xmlSchemaTypePtr)0x0) {
      data_local._4_4_ = -1;
    }
    else {
      if (value2_local == (xmlChar *)0x0) {
        iVar1 = xmlSchemaValPredefTypeNode
                          ((xmlSchemaTypePtr)res1,(xmlChar *)ctxt1_local,&res2,
                           (xmlNodePtr)comp1_local);
        if (iVar1 != 0) {
          return -1;
        }
        if (res2 == (xmlSchemaValPtr)0x0) {
          return -1;
        }
        typ._4_4_ = 0;
      }
      else {
        res2 = (xmlSchemaValPtr)value2_local;
      }
      typ._4_4_ = xmlSchemaValPredefTypeNode((xmlSchemaTypePtr)res1,pxStack_40,&local_60,ctxt2);
      if (typ._4_4_ == 0) {
        typ._4_4_ = xmlSchemaCompareValues(res2,local_60);
        if (res2 != (xmlSchemaValPtr)value2_local) {
          xmlSchemaFreeValue(res2);
        }
        xmlSchemaFreeValue(local_60);
        if (typ._4_4_ == -2) {
          data_local._4_4_ = -1;
        }
        else if (typ._4_4_ == 0) {
          data_local._4_4_ = 1;
        }
        else {
          data_local._4_4_ = 0;
        }
      }
      else {
        if (res2 != (xmlSchemaValPtr)value2_local) {
          xmlSchemaFreeValue(res2);
        }
        data_local._4_4_ = -1;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

static int
xmlRelaxNGSchemaTypeCompare(void *data ATTRIBUTE_UNUSED,
                            const xmlChar * type,
                            const xmlChar * value1,
                            xmlNodePtr ctxt1,
                            void *comp1,
                            const xmlChar * value2, xmlNodePtr ctxt2)
{
    int ret;
    xmlSchemaTypePtr typ;
    xmlSchemaValPtr res1 = NULL, res2 = NULL;

    if ((type == NULL) || (value1 == NULL) || (value2 == NULL))
        return (-1);
    typ = xmlSchemaGetPredefinedType(type,
                                     BAD_CAST
                                     "http://www.w3.org/2001/XMLSchema");
    if (typ == NULL)
        return (-1);
    if (comp1 == NULL) {
        ret = xmlSchemaValPredefTypeNode(typ, value1, &res1, ctxt1);
        if (ret != 0)
            return (-1);
        if (res1 == NULL)
            return (-1);
    } else {
        res1 = (xmlSchemaValPtr) comp1;
    }
    ret = xmlSchemaValPredefTypeNode(typ, value2, &res2, ctxt2);
    if (ret != 0) {
	if (res1 != (xmlSchemaValPtr) comp1)
	    xmlSchemaFreeValue(res1);
        return (-1);
    }
    ret = xmlSchemaCompareValues(res1, res2);
    if (res1 != (xmlSchemaValPtr) comp1)
        xmlSchemaFreeValue(res1);
    xmlSchemaFreeValue(res2);
    if (ret == -2)
        return (-1);
    if (ret == 0)
        return (1);
    return (0);
}